

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluShaderProgram.cpp
# Opt level: O0

TestLog * glu::operator<<(TestLog *log,ShaderProgram *shaderProgram)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  ProgramInfo *programInfo;
  size_type numShaders;
  ShaderInfo **local_80;
  ShaderInfo *local_50 [3];
  int local_38;
  ShaderType local_34;
  int shaderNdx;
  int shaderType;
  vector<const_glu::ShaderInfo_*,_std::allocator<const_glu::ShaderInfo_*>_> shaderPtrs;
  ShaderProgram *shaderProgram_local;
  TestLog *log_local;
  
  shaderPtrs.super__Vector_base<const_glu::ShaderInfo_*,_std::allocator<const_glu::ShaderInfo_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)shaderProgram;
  std::vector<const_glu::ShaderInfo_*,_std::allocator<const_glu::ShaderInfo_*>_>::vector
            ((vector<const_glu::ShaderInfo_*,_std::allocator<const_glu::ShaderInfo_*>_> *)&shaderNdx
            );
  for (local_34 = SHADERTYPE_VERTEX; (int)local_34 < 6; local_34 = local_34 + SHADERTYPE_FRAGMENT) {
    local_38 = 0;
    while( true ) {
      iVar1 = local_38;
      iVar3 = ShaderProgram::getNumShaders
                        ((ShaderProgram *)
                         shaderPtrs.
                         super__Vector_base<const_glu::ShaderInfo_*,_std::allocator<const_glu::ShaderInfo_*>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,local_34);
      if (iVar3 <= iVar1) break;
      local_50[0] = ShaderProgram::getShaderInfo
                              ((ShaderProgram *)
                               shaderPtrs.
                               super__Vector_base<const_glu::ShaderInfo_*,_std::allocator<const_glu::ShaderInfo_*>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,local_34,local_38)
      ;
      std::vector<const_glu::ShaderInfo_*,_std::allocator<const_glu::ShaderInfo_*>_>::push_back
                ((vector<const_glu::ShaderInfo_*,_std::allocator<const_glu::ShaderInfo_*>_> *)
                 &shaderNdx,local_50);
      local_38 = local_38 + 1;
    }
  }
  programInfo = ShaderProgram::getProgramInfo
                          ((ShaderProgram *)
                           shaderPtrs.
                           super__Vector_base<const_glu::ShaderInfo_*,_std::allocator<const_glu::ShaderInfo_*>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
  numShaders = std::vector<const_glu::ShaderInfo_*,_std::allocator<const_glu::ShaderInfo_*>_>::size
                         ((vector<const_glu::ShaderInfo_*,_std::allocator<const_glu::ShaderInfo_*>_>
                           *)&shaderNdx);
  bVar2 = std::vector<const_glu::ShaderInfo_*,_std::allocator<const_glu::ShaderInfo_*>_>::empty
                    ((vector<const_glu::ShaderInfo_*,_std::allocator<const_glu::ShaderInfo_*>_> *)
                     &shaderNdx);
  if (bVar2) {
    local_80 = (ShaderInfo **)0x0;
  }
  else {
    local_80 = std::vector<const_glu::ShaderInfo_*,_std::allocator<const_glu::ShaderInfo_*>_>::
               operator[]((vector<const_glu::ShaderInfo_*,_std::allocator<const_glu::ShaderInfo_*>_>
                           *)&shaderNdx,0);
  }
  logShaderProgram(log,programInfo,numShaders,local_80);
  std::vector<const_glu::ShaderInfo_*,_std::allocator<const_glu::ShaderInfo_*>_>::~vector
            ((vector<const_glu::ShaderInfo_*,_std::allocator<const_glu::ShaderInfo_*>_> *)&shaderNdx
            );
  return log;
}

Assistant:

tcu::TestLog& operator<< (tcu::TestLog& log, const ShaderProgram& shaderProgram)
{
	std::vector<const ShaderInfo*>	shaderPtrs;

	for (int shaderType = 0; shaderType < SHADERTYPE_LAST; shaderType++)
	{
		for (int shaderNdx = 0; shaderNdx < shaderProgram.getNumShaders((ShaderType)shaderType); shaderNdx++)
			shaderPtrs.push_back(&shaderProgram.getShaderInfo((ShaderType)shaderType, shaderNdx));
	}

	logShaderProgram(log, shaderProgram.getProgramInfo(), shaderPtrs.size(), shaderPtrs.empty() ? DE_NULL : &shaderPtrs[0]);

	return log;
}